

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O3

type __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<std::optional<int>,std::allocator<std::optional<int>>>,void>
::to_json<std::vector<std::optional<int>,std::allocator<std::optional<int>>>>
          (json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<std::optional<int>,std::allocator<std::optional<int>>>,void>
           *this,vector<std::optional<int>,_std::allocator<std::optional<int>_>_> *val)

{
  pointer poVar1;
  void *pvVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  const_iterator it;
  pointer val_00;
  type tVar4;
  
  pvVar2 = operator_new(0x20);
  *(undefined8 *)((long)pvVar2 + 8) = 0;
  *(undefined8 *)((long)pvVar2 + 0x10) = 0;
  *(undefined8 *)((long)pvVar2 + 0x18) = 0;
  *(undefined2 *)this = 0xe;
  *(void **)(this + 8) = pvVar2;
  val_00 = (val->super__Vector_base<std::optional<int>,_std::allocator<std::optional<int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  poVar1 = (val->super__Vector_base<std::optional<int>,_std::allocator<std::optional<int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::reserve
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
             (long)poVar1 - (long)val_00 >> 3);
  uVar3 = extraout_RDX;
  for (; val_00 != poVar1; val_00 = val_00 + 1) {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    push_back<std::optional<int>const&>
              ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,val_00);
    uVar3 = extraout_RDX_00;
  }
  tVar4.field_0.int64_.val_ = uVar3;
  tVar4.field_0._0_8_ = this;
  return (type)tVar4.field_0;
}

Assistant:

static typename std::enable_if<!ext_traits::is_std_byte<typename Container::value_type>::value,Json>::type
        to_json(const T& val)
        {
            Json j(json_array_arg);
            auto first = std::begin(val);
            auto last = std::end(val);
            std::size_t size = std::distance(first,last);
            j.reserve(size);
            for (auto it = first; it != last; ++it)
            {
                j.push_back(*it);
            }
            return j;
        }